

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O0

Index __thiscall
MADPComponentFactoredStates::FactorValueIndicesToStateIndex
          (MADPComponentFactoredStates *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *s_e_vec,Scope *sfSC)

{
  Index IVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  Index sI_e;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_sf_e;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc0;
  allocator_type local_31 [49];
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  __a = local_31;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xafea7b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
             ,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xafea9b);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
            (in_stack_ffffffffffffffc0,
             (Scope *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  IVar1 = IndexTools::IndividualToJointIndices
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  return IVar1;
}

Assistant:

Index MADPComponentFactoredStates::
FactorValueIndicesToStateIndex(const vector<Index>& s_e_vec, 
        const Scope& sfSC) const
{
    vector<size_t> nr_sf_e(sfSC.size());
    IndexTools::RestrictIndividualIndicesToScope(
        _m_sfacDomainSizes, sfSC, nr_sf_e);
    Index sI_e = IndexTools::IndividualToJointIndices( s_e_vec, nr_sf_e);
    return(sI_e);
}